

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_array(Context *ctx,VariableList *var)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = var->index;
  uVar1 = ctx->uniform_float4_count;
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"const int ARRAYBASE_%d = %d;",(ulong)uVar2,(ulong)uVar1);
  if (0 < ctx->output_stack_len) {
    uVar2 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar2;
    ctx->output = ctx->output_stack[uVar2];
    ctx->indent = ctx->indent_stack[uVar2];
    var->emit_position = uVar1;
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_METAL_array(Context *ctx, VariableList *var)
{
    // All uniforms (except constant arrays, which are literally constant
    //  data embedded in Metal shaders) are now packed into a single array,
    //  so we can batch the uniform transfers. So this doesn't actually
    //  define an array here; the one, big array is emitted during
    //  finalization instead.
    // However, we need to #define the offset into the one, big array here,
    //  and let dereferences use that #define.
    const int base = var->index;
    const int metalbase = ctx->uniform_float4_count;
    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;
    output_line(ctx, "const int ARRAYBASE_%d = %d;", base, metalbase);
    pop_output(ctx);
    var->emit_position = metalbase;
}